

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scl.c
# Opt level: O0

int Scl_CommandReadScl(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  SC_Lib *pLib_00;
  char *pcVar3;
  int fDump;
  int c;
  char *pFileName;
  SC_Lib *pLib;
  FILE *pFile;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  bVar1 = false;
  Extra_UtilGetoptReset();
  while (iVar2 = Extra_UtilGetopt(argc,argv,"dh"), iVar2 != -1) {
    if (iVar2 != 100) goto LAB_00524d07;
    bVar1 = (bool)(bVar1 ^ 1);
  }
  if (argc == globalUtilOptind + 1) {
    pcVar3 = argv[globalUtilOptind];
    __stream = fopen(pcVar3,"rb");
    if (__stream == (FILE *)0x0) {
      fprintf((FILE *)pAbc->Err,"Cannot open input file \"%s\". \n",pcVar3);
      pAbc_local._4_4_ = 1;
    }
    else {
      fclose(__stream);
      pLib_00 = Abc_SclReadFromFile(pcVar3);
      if (pLib_00 == (SC_Lib *)0x0) {
        fprintf((FILE *)pAbc->Err,"Reading SCL library from file \"%s\" has failed. \n",pcVar3);
        pAbc_local._4_4_ = 1;
      }
      else {
        Abc_SclLoad(pLib_00,(SC_Lib **)&pAbc->pLibScl);
        if (bVar1) {
          pcVar3 = Extra_FileNameGenericAppend(pcVar3,"_temp.lib");
          Abc_SclWriteLiberty(pcVar3,(SC_Lib *)pAbc->pLibScl);
        }
        if (pAbc->pLibScl != (void *)0x0) {
          Abc_SclInstallGenlib(pAbc->pLibScl,0.0,0.0,0);
          Mio_LibraryTransferCellIds();
        }
        pAbc_local._4_4_ = 0;
      }
    }
  }
  else {
LAB_00524d07:
    fprintf((FILE *)pAbc->Err,"usage: read_scl [-dh] <file>\n");
    fprintf((FILE *)pAbc->Err,"\t         reads extracted Liberty library from file\n");
    pcVar3 = "no";
    if (bVar1) {
      pcVar3 = "yes";
    }
    fprintf((FILE *)pAbc->Err,
            "\t-d     : toggle dumping the parsed library into file \"*_temp.lib\" [default = %s]\n"
            ,pcVar3);
    fprintf((FILE *)pAbc->Err,"\t-h     : prints the command summary\n");
    fprintf((FILE *)pAbc->Err,"\t<file> : the name of a file to read\n");
    pAbc_local._4_4_ = 1;
  }
  return pAbc_local._4_4_;
}

Assistant:

int Scl_CommandReadScl( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    FILE * pFile;
    SC_Lib * pLib;
    char * pFileName;
    int c, fDump = 0;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "dh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'd':
            fDump ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;

    // get the input file name
    pFileName = argv[globalUtilOptind];
    if ( (pFile = fopen( pFileName, "rb" )) == NULL )
    {
        fprintf( pAbc->Err, "Cannot open input file \"%s\". \n", pFileName );
        return 1;
    }
    fclose( pFile );

    // read new library
    pLib = Abc_SclReadFromFile( pFileName );
    if ( pLib == NULL )
    {
        fprintf( pAbc->Err, "Reading SCL library from file \"%s\" has failed. \n", pFileName );
        return 1;
    }
    Abc_SclLoad( pLib, (SC_Lib **)&pAbc->pLibScl );
    if ( fDump )
        Abc_SclWriteLiberty( Extra_FileNameGenericAppend(pFileName, "_temp.lib"), (SC_Lib *)pAbc->pLibScl );
    // extract genlib library
    if ( pAbc->pLibScl )
    {
        Abc_SclInstallGenlib( pAbc->pLibScl, 0, 0, 0 );
        Mio_LibraryTransferCellIds();
    }
    return 0;

usage:
    fprintf( pAbc->Err, "usage: read_scl [-dh] <file>\n" );
    fprintf( pAbc->Err, "\t         reads extracted Liberty library from file\n" );
    fprintf( pAbc->Err, "\t-d     : toggle dumping the parsed library into file \"*_temp.lib\" [default = %s]\n", fDump? "yes": "no" );
    fprintf( pAbc->Err, "\t-h     : prints the command summary\n" );
    fprintf( pAbc->Err, "\t<file> : the name of a file to read\n" );
    return 1;
}